

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int my_stricmp(char *s1,char *s2)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *in_RSI;
  char *in_RDI;
  int v;
  char c2;
  char c1;
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    cVar1 = *local_8;
    cVar2 = *local_10;
    iVar3 = tolower((int)cVar1);
    iVar4 = tolower((int)cVar2);
    if (iVar3 - iVar4 != 0) {
      return iVar3 - iVar4;
    }
    if (cVar1 == '\0') break;
    local_10 = local_10 + 1;
    local_8 = local_8 + 1;
    if (cVar2 == '\0') {
      return 0;
    }
  }
  return 0;
}

Assistant:

int my_stricmp(const char *s1, const char *s2)
{
    char c1, c2;
    int v;

    while(1) {
        c1 = *s1++;
        c2 = *s2++;
        v = tolower(c1) - tolower(c2);
        if (v != 0 || c1 == 0 || c2 == 0) break;
    }

    return v;
}